

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGlobalPooling3dLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  NeuralNetworkLayer *pNVar1;
  bool bVar2;
  allocator local_121;
  string local_120;
  Result local_100;
  allocator local_d1;
  string local_d0;
  Result local_b0;
  Result local_88;
  Result local_50;
  undefined1 local_21;
  NeuralNetworkLayer *local_20;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *r;
  
  local_21 = 0;
  local_20 = layer;
  layer_local = (NeuralNetworkLayer *)this;
  this_local = (NeuralNetworkSpecValidator *)__return_storage_ptr__;
  Result::Result(__return_storage_ptr__);
  validateInputCount(&local_50,local_20,1,1);
  Result::operator=(__return_storage_ptr__,&local_50);
  Result::~Result(&local_50);
  bVar2 = Result::good(__return_storage_ptr__);
  if (bVar2) {
    validateOutputCount(&local_88,local_20,1,1);
    Result::operator=(__return_storage_ptr__,&local_88);
    Result::~Result(&local_88);
    bVar2 = Result::good(__return_storage_ptr__);
    pNVar1 = local_20;
    if ((bVar2) && ((this->ndArrayInterpretation & 1U) != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"Pooling3d",&local_d1);
      validateInputOutputRankEquality(&local_b0,pNVar1,&local_d0,&this->blobNameToRank);
      Result::operator=(__return_storage_ptr__,&local_b0);
      Result::~Result(&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      bVar2 = Result::good(__return_storage_ptr__);
      pNVar1 = local_20;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_120,"Pooling3d",&local_121);
        validateRankCount(&local_100,pNVar1,&local_120,5,-1,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,&local_100);
        Result::~Result(&local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)&local_121);
        Result::good(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGlobalPooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) {return r;}

    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank);
        if (!r.good()) {return r;}
        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        r = validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    return r;
}